

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetBXMarkerInfo(ndicapi *pol,int portHandle,int marker,char *outMarkerInfo)

{
  int iVar1;
  byte bVar2;
  char (*pacVar3) [11];
  ulong uVar4;
  
  iVar1 = 0;
  if (marker < 0x14) {
    pacVar3 = pol->BxToolMarkerInformation;
    iVar1 = 1;
    for (uVar4 = 0; pol->BxHandleCount != uVar4; uVar4 = uVar4 + 1) {
      if (pol->BxHandles[uVar4] == portHandle) {
        if (pol->BxHandleCount == uVar4) {
          return 1;
        }
        bVar2 = (*pacVar3)[marker / -2 + 0xb] & 0xf0;
        if ((marker & 1U) == 0) {
          bVar2 = (*pacVar3)[marker / -2 + 0xb];
        }
        *outMarkerInfo = bVar2;
        return 0;
      }
      pacVar3 = pacVar3 + 1;
    }
  }
  return iVar1;
}

Assistant:

ndicapiExport int ndiGetBXMarkerInfo(ndicapi* pol, int portHandle, int marker, char& outMarkerInfo)
{
  int i, n;

  if (marker >= 20)
  {
    return false;
  }

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  int byteIndex = marker / 2;
  if (marker % 2 == 0)
  {
    // low 4 bits, little endian format, so index backwards from the rear
    outMarkerInfo = pol->BxToolMarkerInformation[i][1 + (10 - byteIndex)] & 0x00FF;
  }
  else
  {
    // high 4 bits, little endian format, so index backwards from the rear
    outMarkerInfo = pol->BxToolMarkerInformation[i][1 + (10 - byteIndex)] & 0xFF00 >> 4;
  }
  return NDI_OKAY;
}